

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

DirHandle * getRealDirHandle(char *_fname)

{
  void *pvVar1;
  _func_int_void_ptr_char_ptr_PHYSFS_Stat_ptr *p_Var2;
  undefined8 uVar3;
  int iVar4;
  size_t sVar5;
  void *pvVar6;
  undefined1 *puVar7;
  size_t len;
  undefined1 *ptr;
  DirHandle **ppDVar8;
  DirHandle *h;
  char *dst;
  undefined1 auStack_68 [8];
  undefined1 local_60 [8];
  PHYSFS_Stat statbuf;
  char *arcfname;
  
  puVar7 = auStack_68;
  if (_fname == (char *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
  }
  else {
    __PHYSFS_platformGrabMutex(stateLock);
    sVar5 = strlen(_fname);
    len = longest_root + sVar5 + 1;
    if (len < 0x100) {
      puVar7 = auStack_68 + -(longest_root + sVar5 + 0x18 & 0xfffffffffffffff0);
      ptr = puVar7;
    }
    else {
      ptr = (undefined1 *)0x0;
    }
    *(undefined8 *)(puVar7 + -8) = 0x1086f7;
    pvVar6 = __PHYSFS_initSmallAlloc(ptr,len);
    if (pvVar6 != (void *)0x0) {
      dst = (char *)(longest_root + (long)pvVar6);
      *(undefined8 *)(puVar7 + -8) = 0x108718;
      iVar4 = sanitizePlatformIndependentPath(_fname,dst);
      if (iVar4 != 0) {
        ppDVar8 = &searchPath;
        while (h = *ppDVar8, h != (DirHandle *)0x0) {
          statbuf._32_8_ = dst;
          *(undefined8 *)(puVar7 + -8) = 0x108742;
          iVar4 = partOfMountPoint(h,dst);
          if (iVar4 != 0) goto LAB_00108775;
          *(undefined8 *)(puVar7 + -8) = 0x108753;
          iVar4 = verifyPath(h,(char **)&statbuf.filetype,0);
          uVar3 = statbuf._32_8_;
          if (iVar4 != 0) {
            pvVar1 = h->opaque;
            p_Var2 = h->funcs->stat;
            *(undefined8 *)(puVar7 + -8) = 0x108768;
            iVar4 = (*p_Var2)(pvVar1,(char *)uVar3,(PHYSFS_Stat *)local_60);
            if (iVar4 != 0) goto LAB_00108775;
          }
          ppDVar8 = &h->next;
        }
      }
      h = (DirHandle *)0x0;
LAB_00108775:
      *(undefined8 *)(puVar7 + -8) = 0x108781;
      __PHYSFS_platformReleaseMutex(stateLock);
      if (*(long *)((long)pvVar6 + -8) == 0) {
        return h;
      }
      *(undefined8 *)(puVar7 + -8) = 0x108795;
      (*__PHYSFS_AllocatorHooks.Free)((void *)((long)pvVar6 + -8));
      return h;
    }
    *(undefined8 *)(puVar7 + -8) = 2;
    uVar3 = *(undefined8 *)(puVar7 + -8);
    *(undefined8 *)(puVar7 + -8) = 0x10879f;
    PHYSFS_setErrorCode((PHYSFS_ErrorCode)uVar3);
    *(undefined8 *)(puVar7 + -8) = 0x1087ab;
    __PHYSFS_platformReleaseMutex(stateLock);
  }
  return (DirHandle *)0x0;
}

Assistant:

static DirHandle *getRealDirHandle(const char *_fname)
{
    DirHandle *retval = NULL;
    char *allocated_fname = NULL;
    char *fname = NULL;
    size_t len;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, NULL);

    __PHYSFS_platformGrabMutex(stateLock);
    len = strlen(_fname) + longest_root + 1;
    allocated_fname = __PHYSFS_smallAlloc(len);
    BAIL_IF_MUTEX(!allocated_fname, PHYSFS_ERR_OUT_OF_MEMORY, stateLock, NULL);
    fname = allocated_fname + longest_root;
    if (sanitizePlatformIndependentPath(_fname, fname))
    {
        DirHandle *i;
        for (i = searchPath; i != NULL; i = i->next)
        {
            char *arcfname = fname;
            if (partOfMountPoint(i, arcfname))
            {
                retval = i;
                break;
            } /* if */
            else if (verifyPath(i, &arcfname, 0))
            {
                PHYSFS_Stat statbuf;
                if (i->funcs->stat(i->opaque, arcfname, &statbuf))
                {
                    retval = i;
                    break;
                } /* if */
            } /* if */
        } /* for */
    } /* if */

    __PHYSFS_platformReleaseMutex(stateLock);
    __PHYSFS_smallFree(allocated_fname);
    return retval;
}